

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# remote_server.cpp
# Opt level: O0

undefined8 readable_size_abi_cxx11_(uint64_t size)

{
  ostream *poVar1;
  long lVar2;
  ulong in_RSI;
  undefined8 in_RDI;
  ostringstream out;
  int point;
  int idx;
  uint64_t r;
  uint64_t s;
  char FILE_SIZE_UNITS [8] [3];
  allocator local_1e9;
  string local_1e8 [48];
  ostringstream local_1b8 [376];
  int local_40;
  int local_3c;
  ulong local_38;
  ulong local_30;
  char local_28 [40];
  
  local_28[0] = 'B';
  local_28[1] = ' ';
  local_28[2] = '\0';
  local_28[3] = 'K';
  local_28[4] = 'B';
  local_28[5] = '\0';
  local_28[6] = 'M';
  local_28[7] = 'B';
  local_28[8] = '\0';
  local_28[9] = 'G';
  local_28[10] = 'B';
  local_28[0xb] = '\0';
  local_28[0xc] = 'T';
  local_28[0xd] = 'B';
  local_28[0xe] = '\0';
  local_28[0xf] = 'P';
  local_28[0x10] = 'B';
  local_28[0x11] = '\0';
  local_28[0x12] = 'E';
  local_28[0x13] = 'B';
  local_28[0x14] = '\0';
  local_28[0x15] = 'Z';
  local_28[0x16] = 'B';
  local_28[0x17] = '\0';
  local_38 = 0;
  local_3c = 0;
  for (local_30 = in_RSI; local_30 >> 10 != 0; local_30 = local_30 >> 10) {
    local_38 = local_30 & 0x3ff;
    local_3c = local_3c + 1;
  }
  local_40 = (int)(local_38 / 100);
  std::__cxx11::ostringstream::ostringstream(local_1b8);
  poVar1 = std::operator<<((ostream *)local_1b8,"");
  std::ostream::operator<<(poVar1,local_30);
  if (local_40 != 0) {
    poVar1 = std::operator<<((ostream *)local_1b8,".");
    std::ostream::operator<<(poVar1,local_40);
  }
  poVar1 = std::operator<<((ostream *)local_1b8," ");
  lVar2 = (long)local_3c;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_1e8,local_28 + lVar2 * 3,&local_1e9);
  std::operator<<(poVar1,local_1e8);
  std::__cxx11::string::~string(local_1e8);
  std::allocator<char>::~allocator((allocator<char> *)&local_1e9);
  std::__cxx11::ostringstream::str();
  std::__cxx11::ostringstream::~ostringstream(local_1b8);
  return in_RDI;
}

Assistant:

std::string readable_size(uint64_t size)
{
    constexpr const char FILE_SIZE_UNITS[8][3]{"B ", "KB", "MB", "GB", "TB", "PB", "EB", "ZB"};
    uint64_t s = size, r = 0;
    int idx = 0;
    while (s / 1024 > 0)
    {
        r = s % 1024;
        s = s / 1024;
        idx++;
    }
    int point = (int)(r / 100);
    std::ostringstream out;
    out << "" << s;
    if (point != 0)
        out << "." << point;
    out << " " << std::string(FILE_SIZE_UNITS[idx]);
    return out.str();
}